

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<char> * __thiscall TPZVec<char>::operator=(TPZVec<char> *this,initializer_list<char> *list)

{
  size_type sVar1;
  const_iterator pcVar2;
  initializer_list<char> *in_RSI;
  TPZVec<char> *in_RDI;
  char *aux;
  const_iterator it_end;
  const_iterator it;
  char *local_28;
  const_iterator local_18;
  
  sVar1 = std::initializer_list<char>::size(in_RSI);
  (*in_RDI->_vptr_TPZVec[3])(in_RDI,sVar1);
  local_18 = std::initializer_list<char>::begin(in_RSI);
  pcVar2 = std::initializer_list<char>::end((initializer_list<char> *)in_RDI);
  local_28 = in_RDI->fStore;
  for (; local_18 != pcVar2; local_18 = local_18 + 1) {
    *local_28 = *local_18;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}